

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetMetricGroupRemoveMetricExp
          (zet_metric_group_handle_t hMetricGroup,zet_metric_handle_t hMetric)

{
  ze_result_t zVar1;
  
  if (DAT_0010e870 != (code *)0x0) {
    zVar1 = (*DAT_0010e870)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupRemoveMetricExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] Handle of the metric group
        zet_metric_handle_t hMetric                     ///< [in] Metric handle to be removed from the metric group.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnRemoveMetricExp = context.zetDdiTable.MetricGroupExp.pfnRemoveMetricExp;
        if( nullptr != pfnRemoveMetricExp )
        {
            result = pfnRemoveMetricExp( hMetricGroup, hMetric );
        }
        else
        {
            // generic implementation
        }

        return result;
    }